

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choice.c
# Opt level: O1

void choice_list(t_choice *x,t_symbol *s,int argc,t_atom *argv)

{
  t_elem_conflict *ptVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  t_float tVar8;
  double dVar9;
  float fVar10;
  float fVar11;
  t_float invec [10];
  t_float atStack_48 [10];
  
  lVar6 = 0;
  do {
    tVar8 = atom_getfloatarg((int)lVar6,argc,argv);
    atStack_48[lVar6] = tVar8;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 10);
  uVar2 = x->x_n;
  if ((int)uVar2 < 1) {
    uVar4 = 0xffffffff;
  }
  else {
    fVar10 = 0.0;
    uVar5 = 0xffffffff;
    lVar6 = 4;
    uVar7 = 0;
    do {
      lVar3 = 0;
      fVar11 = 0.0;
      do {
        fVar11 = fVar11 + *(float *)((long)x->x_vec->e_weight + lVar3 * 4 + lVar6 + -4) *
                          atStack_48[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 10);
      if (x->x_nonrepeat != 0) {
        dVar9 = log((double)x->x_vec[uVar7].e_age);
        fVar11 = fVar11 * (float)dVar9;
      }
      if (fVar10 < fVar11) {
        uVar5 = uVar7 & 0xffffffff;
        fVar10 = fVar11;
      }
      uVar4 = (uint)uVar5;
      uVar7 = uVar7 + 1;
      uVar2 = x->x_n;
      lVar6 = lVar6 + 0x2c;
    } while ((long)uVar7 < (long)(int)uVar2);
  }
  if (-1 < (int)uVar4) {
    if (0 < (int)uVar2) {
      ptVar1 = x->x_vec;
      lVar6 = 0;
      do {
        *(float *)((long)ptVar1->e_weight + lVar6 + -4) =
             *(float *)((long)ptVar1->e_weight + lVar6 + -4) + 1.0;
        lVar6 = lVar6 + 0x2c;
      } while ((ulong)uVar2 * 0x2c - lVar6 != 0);
    }
    x->x_vec[uVar4].e_age = 1.0;
  }
  outlet_float((x->x_obj).te_outlet,(float)(int)uVar4);
  return;
}

Assistant:

static void choice_list(t_choice *x, t_symbol *s, int argc, t_atom *argv)
{
    int i, j;
    t_float bestsum = 0;
    int bestindex = -1;
    t_float invec[DIMENSION];
    for (i = 0; i < DIMENSION; i++)
        invec[i] = atom_getfloatarg(i, argc, argv);
    for (j = 0; j < x->x_n; j++)
    {
        t_elem *e = x->x_vec + j;
        t_float sum;
        for (i = 0, sum = 0; i < DIMENSION; i++)
            sum += e->e_weight[i] * invec[i];
        if (x->x_nonrepeat) sum *= (t_float)(log(e->e_age));
        if (sum > bestsum)
        {
            bestsum = sum;
            sum = 1;
            bestindex = j;
        }
    }
    if (bestindex >= 0)
    {
        for (j = 0; j < x->x_n; j++)
            x->x_vec[j].e_age += 1.;
        x->x_vec[bestindex].e_age = 1;
    }
    outlet_float(x->x_obj.ob_outlet, (t_float)bestindex);
}